

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

string * __thiscall
CLI::FailureMessage::simple_abi_cxx11_
          (string *__return_storage_ptr__,FailureMessage *this,App *app,Error *e)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Option *pOVar3;
  allocator<char> local_139;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  string local_98;
  undefined1 local_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  allocator<char> local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  byte local_21;
  App *local_20;
  Error *e_local;
  App *app_local;
  string *header;
  
  local_21 = 0;
  local_20 = app;
  e_local = (Error *)this;
  app_local = (App *)__return_storage_ptr__;
  iVar2 = (*app->_vptr_App[2])();
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,(char *)CONCAT44(extraout_var,iVar2),&local_49);
  ::std::operator+(__return_storage_ptr__,&local_48,"\n");
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_78);
  pOVar3 = App::get_help_ptr((App *)e_local);
  if (pOVar3 != (Option *)0x0) {
    pOVar3 = App::get_help_ptr((App *)e_local);
    e = (Error *)0x0;
    Option::get_name_abi_cxx11_(&local_98,pOVar3,false,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_78,&local_98);
    ::std::__cxx11::string::~string((string *)&local_98);
  }
  pOVar3 = App::get_help_all_ptr((App *)e_local);
  if (pOVar3 != (Option *)0x0) {
    pOVar3 = App::get_help_all_ptr((App *)e_local);
    e = (Error *)0x0;
    Option::get_name_abi_cxx11_(&local_b8,pOVar3,false,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_78,&local_b8);
    ::std::__cxx11::string::~string((string *)&local_b8);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_78);
  if (!bVar1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_138," or ",&local_139);
    detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_118,(detail *)local_78,&local_138,(string *)e);
    ::std::operator+(&local_f8,"Run with ",&local_118);
    ::std::operator+(&local_d8,&local_f8," for more information.\n");
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_d8);
    ::std::__cxx11::string::~string((string *)&local_d8);
    ::std::__cxx11::string::~string((string *)&local_f8);
    ::std::__cxx11::string::~string((string *)&local_118);
    ::std::__cxx11::string::~string((string *)&local_138);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_139);
  }
  local_21 = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_78);
  if ((local_21 & 1) == 0) {
    ::std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string simple(const App *app, const Error &e) {
    std::string header = std::string(e.what()) + "\n";
    std::vector<std::string> names;

    // Collect names
    if(app->get_help_ptr() != nullptr)
        names.push_back(app->get_help_ptr()->get_name());

    if(app->get_help_all_ptr() != nullptr)
        names.push_back(app->get_help_all_ptr()->get_name());

    // If any names found, suggest those
    if(!names.empty())
        header += "Run with " + detail::join(names, " or ") + " for more information.\n";

    return header;
}